

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

int __thiscall CGraphics_Threaded::UnloadTexture(CGraphics_Threaded *this,CTextureHandle *pIndex)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  CTextureHandle *in_RSI;
  CCommandBuffer *in_RDI;
  long in_FS_OFFSET;
  CTextureDestroyCommand Cmd;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = IGraphics::CTextureHandle::Id(in_RSI);
  iVar4 = IGraphics::CTextureHandle::Id
                    ((CTextureHandle *)((long)&in_RDI[0x6008].m_pCmdBufferHead + 4));
  if ((iVar3 != iVar4) &&
     (bVar2 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x12ea1a), bVar2)) {
    CCommandBuffer::CTextureDestroyCommand::CTextureDestroyCommand
              ((CTextureDestroyCommand *)0x12ea35);
    IGraphics::CTextureHandle::Id(in_RSI);
    CCommandBuffer::AddCommand<CCommandBuffer::CTextureDestroyCommand>
              (in_RDI,(CTextureDestroyCommand *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    uVar5 = in_RDI[0x615e].m_CmdBuffer.m_Used;
    iVar3 = IGraphics::CTextureHandle::Id(in_RSI);
    *(uint *)((long)&in_RDI[0x6008].m_pCmdBufferTail + (long)iVar3 * 4 + 4) = uVar5;
    uVar5 = IGraphics::CTextureHandle::Id(in_RSI);
    in_RDI[0x615e].m_CmdBuffer.m_Used = uVar5;
    IGraphics::CTextureHandle::Invalidate(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int CGraphics_Threaded::UnloadTexture(CTextureHandle *pIndex)
{
	if(pIndex->Id() == m_InvalidTexture.Id())
		return 0;

	if(!pIndex->IsValid())
		return 0;

	CCommandBuffer::CTextureDestroyCommand Cmd;
	Cmd.m_Slot = pIndex->Id();
	m_pCommandBuffer->AddCommand(Cmd);

	m_aTextureIndices[pIndex->Id()] = m_FirstFreeTexture;
	m_FirstFreeTexture = pIndex->Id();

	pIndex->Invalidate();
	return 0;
}